

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.h
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::InterfaceVariableScalarReplacement
          (InterfaceVariableScalarReplacement *this)

{
  InterfaceVariableScalarReplacement *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__InterfaceVariableScalarReplacement_013be050;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->interface_vars_removed_from_entry_point_operands_);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->composite_ids_to_component_depths);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::unordered_set(&this->vars_with_extra_arrayness);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::unordered_set(&this->vars_without_extra_arrayness);
  return;
}

Assistant:

InterfaceVariableScalarReplacement() {}